

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O2

uint256 * __thiscall
CPartialMerkleTree::CalcHash
          (uint256 *__return_storage_ptr__,CPartialMerkleTree *this,int height,uint pos,
          vector<uint256,_std::allocator<uint256>_> *vTxid)

{
  uint pos_00;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer puVar5;
  int height_00;
  long in_FS_OFFSET;
  uint256 local_78;
  uint256 left;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = (vTxid->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vTxid->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.super__Vector_impl_data
      ._M_finish == puVar5) {
    __assert_fail("vTxid.size() != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/merkleblock.cpp"
                  ,0x3d,
                  "uint256 CPartialMerkleTree::CalcHash(int, unsigned int, const std::vector<uint256> &)"
                 );
  }
  if (height == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00a92f6f;
    puVar5 = puVar5 + pos;
    uVar2 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
    uVar3 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
    uVar4 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar4;
    *(undefined8 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems = uVar2;
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) = uVar3;
  }
  else {
    height_00 = height + -1;
    CalcHash(&left,this,height_00,pos * 2,vTxid);
    local_78.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_78.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    pos_00 = pos * 2 + 1;
    if (pos_00 < ~(-1 << ((byte)height_00 & 0x1f)) + this->nTransactions >> ((byte)height_00 & 0x1f)
       ) {
      CalcHash(&local_78,this,height_00,pos_00,vTxid);
    }
    else {
      local_78.super_base_blob<256U>.m_data._M_elems[0x10] =
           left.super_base_blob<256U>.m_data._M_elems[0x10];
      local_78.super_base_blob<256U>.m_data._M_elems[0x11] =
           left.super_base_blob<256U>.m_data._M_elems[0x11];
      local_78.super_base_blob<256U>.m_data._M_elems[0x12] =
           left.super_base_blob<256U>.m_data._M_elems[0x12];
      local_78.super_base_blob<256U>.m_data._M_elems[0x13] =
           left.super_base_blob<256U>.m_data._M_elems[0x13];
      local_78.super_base_blob<256U>.m_data._M_elems[0x14] =
           left.super_base_blob<256U>.m_data._M_elems[0x14];
      local_78.super_base_blob<256U>.m_data._M_elems[0x15] =
           left.super_base_blob<256U>.m_data._M_elems[0x15];
      local_78.super_base_blob<256U>.m_data._M_elems[0x16] =
           left.super_base_blob<256U>.m_data._M_elems[0x16];
      local_78.super_base_blob<256U>.m_data._M_elems[0x17] =
           left.super_base_blob<256U>.m_data._M_elems[0x17];
      local_78.super_base_blob<256U>.m_data._M_elems[0x18] =
           left.super_base_blob<256U>.m_data._M_elems[0x18];
      local_78.super_base_blob<256U>.m_data._M_elems[0x19] =
           left.super_base_blob<256U>.m_data._M_elems[0x19];
      local_78.super_base_blob<256U>.m_data._M_elems[0x1a] =
           left.super_base_blob<256U>.m_data._M_elems[0x1a];
      local_78.super_base_blob<256U>.m_data._M_elems[0x1b] =
           left.super_base_blob<256U>.m_data._M_elems[0x1b];
      local_78.super_base_blob<256U>.m_data._M_elems[0x1c] =
           left.super_base_blob<256U>.m_data._M_elems[0x1c];
      local_78.super_base_blob<256U>.m_data._M_elems[0x1d] =
           left.super_base_blob<256U>.m_data._M_elems[0x1d];
      local_78.super_base_blob<256U>.m_data._M_elems[0x1e] =
           left.super_base_blob<256U>.m_data._M_elems[0x1e];
      local_78.super_base_blob<256U>.m_data._M_elems[0x1f] =
           left.super_base_blob<256U>.m_data._M_elems[0x1f];
      local_78.super_base_blob<256U>.m_data._M_elems[0] =
           left.super_base_blob<256U>.m_data._M_elems[0];
      local_78.super_base_blob<256U>.m_data._M_elems[1] =
           left.super_base_blob<256U>.m_data._M_elems[1];
      local_78.super_base_blob<256U>.m_data._M_elems[2] =
           left.super_base_blob<256U>.m_data._M_elems[2];
      local_78.super_base_blob<256U>.m_data._M_elems[3] =
           left.super_base_blob<256U>.m_data._M_elems[3];
      local_78.super_base_blob<256U>.m_data._M_elems[4] =
           left.super_base_blob<256U>.m_data._M_elems[4];
      local_78.super_base_blob<256U>.m_data._M_elems[5] =
           left.super_base_blob<256U>.m_data._M_elems[5];
      local_78.super_base_blob<256U>.m_data._M_elems[6] =
           left.super_base_blob<256U>.m_data._M_elems[6];
      local_78.super_base_blob<256U>.m_data._M_elems[7] =
           left.super_base_blob<256U>.m_data._M_elems[7];
      local_78.super_base_blob<256U>.m_data._M_elems[8] =
           left.super_base_blob<256U>.m_data._M_elems[8];
      local_78.super_base_blob<256U>.m_data._M_elems[9] =
           left.super_base_blob<256U>.m_data._M_elems[9];
      local_78.super_base_blob<256U>.m_data._M_elems[10] =
           left.super_base_blob<256U>.m_data._M_elems[10];
      local_78.super_base_blob<256U>.m_data._M_elems[0xb] =
           left.super_base_blob<256U>.m_data._M_elems[0xb];
      local_78.super_base_blob<256U>.m_data._M_elems[0xc] =
           left.super_base_blob<256U>.m_data._M_elems[0xc];
      local_78.super_base_blob<256U>.m_data._M_elems[0xd] =
           left.super_base_blob<256U>.m_data._M_elems[0xd];
      local_78.super_base_blob<256U>.m_data._M_elems[0xe] =
           left.super_base_blob<256U>.m_data._M_elems[0xe];
      local_78.super_base_blob<256U>.m_data._M_elems[0xf] =
           left.super_base_blob<256U>.m_data._M_elems[0xf];
    }
    Hash<uint256,uint256>(__return_storage_ptr__,&left,&local_78);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_00a92f6f:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

uint256 CPartialMerkleTree::CalcHash(int height, unsigned int pos, const std::vector<uint256> &vTxid) {
    //we can never have zero txs in a merkle block, we always need the coinbase tx
    //if we do not have this assert, we can hit a memory access violation when indexing into vTxid
    assert(vTxid.size() != 0);
    if (height == 0) {
        // hash at height 0 is the txids themselves
        return vTxid[pos];
    } else {
        // calculate left hash
        uint256 left = CalcHash(height-1, pos*2, vTxid), right;
        // calculate right hash if not beyond the end of the array - copy left hash otherwise
        if (pos*2+1 < CalcTreeWidth(height-1))
            right = CalcHash(height-1, pos*2+1, vTxid);
        else
            right = left;
        // combine subhashes
        return Hash(left, right);
    }
}